

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdmerge.c
# Opt level: O3

void h2v2_merged_upsample_565
               (j_decompress_ptr cinfo,JSAMPIMAGE input_buf,JDIMENSION in_row_group_ctr,
               JSAMPARRAY output_buf)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  jpeg_upsampler *pjVar5;
  JSAMPLE *pJVar6;
  _func_void_j_decompress_ptr_JSAMPIMAGE_JDIMENSION_ptr_JDIMENSION_JSAMPARRAY_JDIMENSION_ptr_JDIMENSION
  *p_Var7;
  _func_void_j_decompress_ptr *p_Var8;
  _func_void_j_decompress_ptr_JSAMPIMAGE_JDIMENSION_ptr_JDIMENSION_JSAMPARRAY_JDIMENSION_ptr_JDIMENSION
  *p_Var9;
  ulong uVar10;
  ulong uVar11;
  byte *pbVar12;
  ushort *puVar13;
  long lVar14;
  ushort *puVar15;
  byte *pbVar16;
  byte *pbVar17;
  long lVar18;
  long lVar19;
  byte *pbVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  
  pjVar5 = cinfo->upsample;
  pJVar6 = cinfo->sample_range_limit;
  p_Var7 = pjVar5[1].upsample;
  lVar18 = *(long *)&pjVar5[1].need_context_rows;
  p_Var8 = pjVar5[2].start_pass;
  p_Var9 = pjVar5[2].upsample;
  pbVar12 = (*input_buf)[in_row_group_ctr * 2];
  pbVar16 = (*input_buf)[(ulong)(in_row_group_ctr * 2) + 1];
  pbVar20 = input_buf[1][in_row_group_ctr];
  pbVar17 = input_buf[2][in_row_group_ctr];
  puVar13 = (ushort *)*output_buf;
  puVar15 = (ushort *)output_buf[1];
  uVar4 = cinfo->output_width;
  if (1 < uVar4) {
    lVar23 = 0;
    lVar24 = 0;
    lVar19 = 0;
    do {
      lVar22 = (long)*(int *)(p_Var7 + (ulong)pbVar17[lVar19] * 4);
      lVar21 = (long)*(int *)(lVar18 + (ulong)pbVar20[lVar19] * 4);
      uVar11 = (ulong)pbVar12[lVar19 * 2];
      lVar14 = (long)(int)((ulong)(*(long *)(p_Var8 + (ulong)pbVar17[lVar19] * 8) +
                                  *(long *)(p_Var9 + (ulong)pbVar20[lVar19] * 8)) >> 0x10);
      uVar10 = (ulong)pbVar12[lVar19 * 2 + 1];
      bVar1 = pJVar6[lVar22 + uVar10];
      bVar2 = pJVar6[uVar10 + lVar14];
      bVar3 = pJVar6[uVar10 + lVar21];
      puVar13[lVar19 * 2] =
           (ushort)(pJVar6[uVar11 + lVar21] >> 3) |
           (pJVar6[lVar22 + uVar11] & 0xfff8) * 0x100 + (pJVar6[uVar11 + lVar14] & 0xfc) * 8;
      puVar13[lVar19 * 2 + 1] = (ushort)(bVar3 >> 3) | (bVar1 & 0xfff8) * 0x100 + (bVar2 & 0xfc) * 8
      ;
      uVar10 = (ulong)pbVar16[lVar19 * 2];
      uVar11 = (ulong)pbVar16[lVar19 * 2 + 1];
      bVar1 = pJVar6[lVar22 + uVar11];
      bVar2 = pJVar6[lVar14 + uVar11];
      bVar3 = pJVar6[lVar21 + uVar11];
      puVar15[lVar19 * 2] =
           (ushort)(pJVar6[uVar10 + lVar21] >> 3) |
           (pJVar6[lVar22 + uVar10] & 0xfff8) * 0x100 + (pJVar6[uVar10 + lVar14] & 0xfc) * 8;
      puVar15[lVar19 * 2 + 1] = (ushort)(bVar3 >> 3) | (bVar1 & 0xfff8) * 0x100 + (bVar2 & 0xfc) * 8
      ;
      lVar19 = lVar19 + 1;
      lVar24 = lVar24 + -2;
      lVar23 = lVar23 + -4;
    } while (uVar4 >> 1 != (uint)lVar19);
    pbVar17 = pbVar17 + lVar19;
    pbVar20 = pbVar20 + lVar19;
    pbVar16 = pbVar16 + -lVar24;
    pbVar12 = pbVar12 + -lVar24;
    puVar15 = (ushort *)((long)puVar15 - lVar23);
    puVar13 = (ushort *)((long)puVar13 - lVar23);
  }
  if ((uVar4 & 1) != 0) {
    lVar19 = (long)*(int *)(p_Var7 + (ulong)*pbVar17 * 4);
    lVar18 = (long)*(int *)(lVar18 + (ulong)*pbVar20 * 4);
    uVar10 = (ulong)*pbVar12;
    lVar23 = (long)(int)((ulong)(*(long *)(p_Var8 + (ulong)*pbVar17 * 8) +
                                *(long *)(p_Var9 + (ulong)*pbVar20 * 8)) >> 0x10);
    *puVar13 = (ushort)(pJVar6[uVar10 + lVar18] >> 3) |
               (pJVar6[lVar19 + uVar10] & 0xfff8) * 0x100 + (pJVar6[uVar10 + lVar23] & 0xfc) * 8;
    uVar10 = (ulong)*pbVar16;
    *puVar15 = (ushort)(pJVar6[lVar18 + uVar10] >> 3) |
               (pJVar6[lVar19 + uVar10] & 0xfff8) * 0x100 + (pJVar6[lVar23 + uVar10] & 0xfc) * 8;
  }
  return;
}

Assistant:

METHODDEF(void)
h2v2_merged_upsample_565(j_decompress_ptr cinfo, JSAMPIMAGE input_buf,
                         JDIMENSION in_row_group_ctr, JSAMPARRAY output_buf)
{
  if (is_big_endian())
    h2v2_merged_upsample_565_be(cinfo, input_buf, in_row_group_ctr,
                                output_buf);
  else
    h2v2_merged_upsample_565_le(cinfo, input_buf, in_row_group_ctr,
                                output_buf);
}